

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall MeCab::DecoderFeatureIndex::openBinaryModel(DecoderFeatureIndex *this,Param *param)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string to;
  string modelfile;
  die local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Param::get<std::__cxx11::string>(&local_48,param,"model");
  iVar2 = Mmap<char>::open(&this->mmap_,local_48._M_dataplus._M_p,0x152cec);
  if ((char)iVar2 == '\0') {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x9e);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"mmap_.open(modelfile.c_str())");
    poVar4 = std::operator<<(poVar4,"] ");
    pcVar5 = whatlog::str(&(this->mmap_).what_);
    std::operator<<(poVar4,pcVar5);
    die::~die((die *)&local_68);
  }
  pcVar5 = (this->mmap_).text;
  bVar1 = openFromArray(this,pcVar5,pcVar5 + (this->mmap_).length);
  if (bVar1) {
    Param::get<std::__cxx11::string>(&local_68,param,"charset");
    iVar2 = decode_charset(this->charset_);
    iVar3 = decode_charset(local_68._M_dataplus._M_p);
    if (iVar2 != iVar3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                              );
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa5);
      poVar4 = std::operator<<(poVar4,") [");
      poVar4 = std::operator<<(poVar4,"decode_charset(charset_) == decode_charset(to.c_str())");
      poVar4 = std::operator<<(poVar4,"] ");
      poVar4 = std::operator<<(poVar4,"model charset and dictionary charset are different. ");
      poVar4 = std::operator<<(poVar4,"model_charset=");
      poVar4 = std::operator<<(poVar4,this->charset_);
      poVar4 = std::operator<<(poVar4," dictionary_charset=");
      std::operator<<(poVar4,(string *)&local_68);
      die::~die(&local_69);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    Mmap<char>::close(&this->mmap_,(int)pcVar5);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool DecoderFeatureIndex::openBinaryModel(const Param &param) {
  const std::string modelfile = param.get<std::string>("model");
  CHECK_DIE(mmap_.open(modelfile.c_str())) << mmap_.what();
  if (!openFromArray(mmap_.begin(), mmap_.end())) {
    mmap_.close();
    return false;
  }
  const std::string to = param.get<std::string>("charset");
  CHECK_DIE(decode_charset(charset_) ==
            decode_charset(to.c_str()))
      << "model charset and dictionary charset are different. "
      << "model_charset=" << charset_
      << " dictionary_charset=" << to;

  return true;
}